

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::SimpleAtod(lts_20250127 *this,string_view str,Nonnull<double_*> out)

{
  bool bVar1;
  const_reference pvVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  size_type sVar5;
  double *value;
  double dVar6;
  string_view sVar7;
  from_chars_result fVar8;
  from_chars_result result;
  Nonnull<double_*> local_38;
  char *local_30;
  Nonnull<double_*> out_local;
  string_view str_local;
  
  value = (double *)str._M_str;
  str_local._M_len = str._M_len;
  *value = 0.0;
  sVar7._M_str = (char *)str_local._M_len;
  sVar7._M_len = (size_t)this;
  out_local = (Nonnull<double_*>)this;
  sVar7 = StripAsciiWhitespace(sVar7);
  local_38 = (Nonnull<double_*>)sVar7._M_len;
  out_local = local_38;
  local_30 = sVar7._M_str;
  str_local._M_len = (size_t)local_30;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
  if ((!bVar1) &&
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,0),
     *pvVar2 == '+')) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,1);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
    if ((!bVar1) &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,0),
       *pvVar2 == '-')) {
      return false;
    }
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
  fVar8 = from_chars(pvVar3,pvVar4 + sVar5,value,general);
  if (fVar8.ec == invalid_argument) {
    str_local._M_str._7_1_ = false;
  }
  else {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
    if (fVar8.ptr == pvVar3 + sVar5) {
      if (fVar8.ec == result_out_of_range) {
        if (*value <= 1.0) {
          if (*value <= -1.0 && *value != -1.0) {
            dVar6 = std::numeric_limits<double>::infinity();
            *value = -dVar6;
          }
        }
        else {
          dVar6 = std::numeric_limits<double>::infinity();
          *value = dVar6;
        }
      }
      str_local._M_str._7_1_ = true;
    }
    else {
      str_local._M_str._7_1_ = false;
    }
  }
  return str_local._M_str._7_1_;
}

Assistant:

bool SimpleAtod(absl::string_view str, absl::Nonnull<double*> out) {
  *out = 0.0;
  str = StripAsciiWhitespace(str);
  // std::from_chars doesn't accept an initial +, but SimpleAtod does, so if one
  // is present, skip it, while avoiding accepting "+-0" as valid.
  if (!str.empty() && str[0] == '+') {
    str.remove_prefix(1);
    if (!str.empty() && str[0] == '-') {
      return false;
    }
  }
  auto result = absl::from_chars(str.data(), str.data() + str.size(), *out);
  if (result.ec == std::errc::invalid_argument) {
    return false;
  }
  if (result.ptr != str.data() + str.size()) {
    // not all non-whitespace characters consumed
    return false;
  }
  // from_chars() with DR 3081's current wording will return max() on
  // overflow.  SimpleAtod returns infinity instead.
  if (result.ec == std::errc::result_out_of_range) {
    if (*out > 1.0) {
      *out = std::numeric_limits<double>::infinity();
    } else if (*out < -1.0) {
      *out = -std::numeric_limits<double>::infinity();
    }
  }
  return true;
}